

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

parasail_result_t * parasail_result_new_trace(int a,int b,size_t alignment,size_t size)

{
  void *pvVar1;
  size_t _size;
  parasail_result_t *result;
  size_t size_local;
  size_t alignment_local;
  int b_local;
  int a_local;
  
  if ((a < 1) || (b < 1)) {
    fprintf(_stderr,"%s: inputs must be > 0\n","parasail_result_new_trace");
    _b_local = (parasail_result_t *)0x0;
  }
  else {
    _b_local = parasail_result_new();
    if (_b_local == (parasail_result_t *)0x0) {
      _b_local = (parasail_result_t *)0x0;
    }
    else {
      pvVar1 = malloc(0x18);
      (_b_local->field_4).extra = pvVar1;
      if ((_b_local->field_4).extra == (void *)0x0) {
        fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_trace",0x18);
        _b_local = (parasail_result_t *)0x0;
      }
      else {
        pvVar1 = parasail_memalign(alignment,size * (long)a * (long)b);
        ((_b_local->field_4).trace)->trace_table = pvVar1;
        if (((_b_local->field_4).rowcols)->score_row == (int *)0x0) {
          _b_local = (parasail_result_t *)0x0;
        }
        else {
          ((_b_local->field_4).rowcols)->score_col = (int *)0x0;
          ((_b_local->field_4).trace)->trace_del_table = (void *)0x0;
        }
      }
    }
  }
  return _b_local;
}

Assistant:

parasail_result_t* parasail_result_new_trace(const int a, const int b, const size_t alignment, const size_t size)
{
    /* declare all variables */
    parasail_result_t *result = NULL;

    VALIDATE_A_B

    /* allocate struct to hold memory */
    result = parasail_result_new();
    if (!result) return NULL;

    PARASAIL_NEW(result->trace, parasail_result_extra_trace_t);
    result->trace->trace_table = parasail_memalign(alignment, size*a*b);
    if (!result->trace->trace_table) return NULL;
    result->trace->trace_ins_table = NULL;
    result->trace->trace_del_table = NULL;

    return result;
}